

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QMovableArrayOps<QCommandLineParserPrivate::PositionalArgumentDefinition>::reallocate
          (QMovableArrayOps<QCommandLineParserPrivate::PositionalArgumentDefinition> *this,
          qsizetype alloc,AllocationOption option)

{
  long lVar1;
  AllocationOption in_EDX;
  qsizetype in_RSI;
  PositionalArgumentDefinition *in_RDI;
  long in_FS_OFFSET;
  pair<QTypedArrayData<QCommandLineParserPrivate::PositionalArgumentDefinition>_*,_QCommandLineParserPrivate::PositionalArgumentDefinition_*>
  pVar2;
  pair<QTypedArrayData<QCommandLineParserPrivate::PositionalArgumentDefinition>_*,_QCommandLineParserPrivate::PositionalArgumentDefinition_*>
  pair;
  PositionalArgumentDefinition *pPStack_10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pVar2 = QTypedArrayData<QCommandLineParserPrivate::PositionalArgumentDefinition>::
          reallocateUnaligned((QTypedArrayData<QCommandLineParserPrivate::PositionalArgumentDefinition>
                               *)&DAT_aaaaaaaaaaaaaaaa,in_RDI,in_RSI,in_EDX);
  qt_noop();
  (in_RDI->name).d.d = (Data *)pVar2.first;
  pPStack_10 = pVar2.second;
  (in_RDI->name).d.ptr = (char16_t *)pPStack_10;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void reallocate(qsizetype alloc, QArrayData::AllocationOption option)
    {
        auto pair = Data::reallocateUnaligned(this->d, this->ptr, alloc, option);
        Q_CHECK_PTR(pair.second);
        Q_ASSERT(pair.first != nullptr);
        this->d = pair.first;
        this->ptr = pair.second;
    }